

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O3

CURLcode Curl_http_auth_act(connectdata *conn)

{
  undefined1 *puVar1;
  uint uVar2;
  Curl_HttpReq CVar3;
  Curl_easy *data;
  _Bool _Var4;
  _Bool _Var5;
  CURLcode CVar6;
  int iVar7;
  char *pcVar8;
  
  data = conn->data;
  pcVar8 = (data->set).str[0x41];
  iVar7 = (data->req).httpcode;
  if (iVar7 - 100U < 100) {
    return CURLE_OK;
  }
  if (((data->state).field_0x514 & 0x20) != 0) {
    if (((data->set).field_0x8ea & 0x10) == 0) {
      return CURLE_OK;
    }
    return CURLE_HTTP_RETURNED_ERROR;
  }
  uVar2 = *(uint *)&(conn->bits).field_0x4;
  if ((((byte)(uVar2 >> 8) & 1 | pcVar8 != (char *)0x0) == 1) &&
     ((iVar7 == 0x191 || (iVar7 < 300 && (uVar2 >> 0x10 & 1) != 0)))) {
    _Var4 = pickoneauth(&(data->state).authhost,-(ulong)(pcVar8 != (char *)0x0) | 0xffffffffffffffbf
                       );
    if (!_Var4) {
      puVar1 = &(data->state).field_0x514;
      *puVar1 = *puVar1 | 0x20;
    }
    if (((data->state).authhost.picked == 8) && (0xb < conn->httpversion)) {
      Curl_infof(data,"Forcing HTTP/1.1 for NTLM");
      Curl_conncontrol(conn,1);
      (conn->data->set).httpversion = 2;
    }
  }
  else {
    _Var4 = false;
  }
  uVar2 = *(uint *)&(conn->bits).field_0x4;
  if (((uVar2 >> 9 & 1) == 0) ||
     ((iVar7 = (data->req).httpcode, iVar7 != 0x197 && (299 < iVar7 || (uVar2 >> 0x10 & 1) == 0))))
  {
LAB_001119e0:
    if (_Var4 == false) {
      if (((((data->req).httpcode < 300) && (((data->state).authhost.field_0x18 & 1) == 0)) &&
          (((conn->bits).field_0x6 & 1) != 0)) &&
         ((CVar3 = (data->set).httpreq, CVar3 != HTTPREQ_GET && (CVar3 != HTTPREQ_HEAD)))) {
        pcVar8 = (*Curl_cstrdup)((data->change).url);
        (data->req).newurl = pcVar8;
        if (pcVar8 == (char *)0x0) {
          return CURLE_OUT_OF_MEMORY;
        }
        puVar1 = &(data->state).authhost.field_0x18;
        *puVar1 = *puVar1 | 1;
      }
      goto LAB_00111a9f;
    }
  }
  else {
    _Var5 = pickoneauth(&(data->state).authproxy,0xffffffffffffffbf);
    if (!_Var5) {
      puVar1 = &(data->state).field_0x514;
      *puVar1 = *puVar1 | 0x20;
      goto LAB_001119e0;
    }
  }
  CVar3 = (data->set).httpreq;
  if (((CVar3 != HTTPREQ_GET) && (CVar3 != HTTPREQ_HEAD)) &&
     ((((conn->bits).field_0x6 & 2) == 0 && (CVar6 = http_perhapsrewind(conn), CVar6 != CURLE_OK))))
  {
    return CVar6;
  }
  (*Curl_cfree)((data->req).newurl);
  (data->req).newurl = (char *)0x0;
  pcVar8 = (*Curl_cstrdup)((data->change).url);
  (data->req).newurl = pcVar8;
  if (pcVar8 == (char *)0x0) {
    return CURLE_OUT_OF_MEMORY;
  }
LAB_00111a9f:
  iVar7 = http_should_fail(conn);
  if (iVar7 == 0) {
    return CURLE_OK;
  }
  Curl_failf(data,"The requested URL returned error: %d",(ulong)(uint)(data->req).httpcode);
  return CURLE_HTTP_RETURNED_ERROR;
}

Assistant:

CURLcode Curl_http_auth_act(struct connectdata *conn)
{
  struct Curl_easy *data = conn->data;
  bool pickhost = FALSE;
  bool pickproxy = FALSE;
  CURLcode result = CURLE_OK;
  unsigned long authmask = ~0ul;

  if(!data->set.str[STRING_BEARER])
    authmask &= (unsigned long)~CURLAUTH_BEARER;

  if(100 <= data->req.httpcode && 199 >= data->req.httpcode)
    /* this is a transient response code, ignore */
    return CURLE_OK;

  if(data->state.authproblem)
    return data->set.http_fail_on_error?CURLE_HTTP_RETURNED_ERROR:CURLE_OK;

  if((conn->bits.user_passwd || data->set.str[STRING_BEARER]) &&
     ((data->req.httpcode == 401) ||
      (conn->bits.authneg && data->req.httpcode < 300))) {
    pickhost = pickoneauth(&data->state.authhost, authmask);
    if(!pickhost)
      data->state.authproblem = TRUE;
    if(data->state.authhost.picked == CURLAUTH_NTLM &&
       conn->httpversion > 11) {
      infof(data, "Forcing HTTP/1.1 for NTLM");
      connclose(conn, "Force HTTP/1.1 connection");
      conn->data->set.httpversion = CURL_HTTP_VERSION_1_1;
    }
  }
  if(conn->bits.proxy_user_passwd &&
     ((data->req.httpcode == 407) ||
      (conn->bits.authneg && data->req.httpcode < 300))) {
    pickproxy = pickoneauth(&data->state.authproxy,
                            authmask & ~CURLAUTH_BEARER);
    if(!pickproxy)
      data->state.authproblem = TRUE;
  }

  if(pickhost || pickproxy) {
    if((data->set.httpreq != HTTPREQ_GET) &&
       (data->set.httpreq != HTTPREQ_HEAD) &&
       !conn->bits.rewindaftersend) {
      result = http_perhapsrewind(conn);
      if(result)
        return result;
    }
    /* In case this is GSS auth, the newurl field is already allocated so
       we must make sure to free it before allocating a new one. As figured
       out in bug #2284386 */
    Curl_safefree(data->req.newurl);
    data->req.newurl = strdup(data->change.url); /* clone URL */
    if(!data->req.newurl)
      return CURLE_OUT_OF_MEMORY;
  }
  else if((data->req.httpcode < 300) &&
          (!data->state.authhost.done) &&
          conn->bits.authneg) {
    /* no (known) authentication available,
       authentication is not "done" yet and
       no authentication seems to be required and
       we didn't try HEAD or GET */
    if((data->set.httpreq != HTTPREQ_GET) &&
       (data->set.httpreq != HTTPREQ_HEAD)) {
      data->req.newurl = strdup(data->change.url); /* clone URL */
      if(!data->req.newurl)
        return CURLE_OUT_OF_MEMORY;
      data->state.authhost.done = TRUE;
    }
  }
  if(http_should_fail(conn)) {
    failf(data, "The requested URL returned error: %d",
          data->req.httpcode);
    result = CURLE_HTTP_RETURNED_ERROR;
  }

  return result;
}